

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emt.c
# Opt level: O3

void emtlst(emtcxdef *ctx,uint ofs,uchar *base)

{
  byte bVar1;
  ushort uVar2;
  ushort uVar3;
  ushort uVar4;
  uchar *puVar5;
  uint16_t tmp_2;
  ushort uVar6;
  ushort uVar7;
  uint *puVar8;
  ulong uVar9;
  uint uVar10;
  
  uVar2 = ctx->emtcxofs;
  emtres(ctx,2);
  puVar5 = ctx->emtcxptr;
  uVar7 = ctx->emtcxofs;
  (puVar5 + uVar7)[0] = '\x02';
  (puVar5 + uVar7)[1] = '\0';
  uVar6 = ctx->emtcxofs + 2;
  ctx->emtcxofs = uVar6;
  if (ofs != 0) {
    uVar7 = *(ushort *)(base + ofs);
    if (uVar7 != 0) {
      puVar8 = (uint *)(base + (ulong)uVar7 * 0x10 + (ulong)ofs);
      uVar9 = (ulong)uVar2;
      do {
        bVar1 = (byte)puVar8[-2];
        if (bVar1 < 0x40) {
          if (bVar1 == 0x36) {
            uVar3 = *(ushort *)(base + *(long *)puVar8);
            emtres(ctx,1);
            uVar4 = ctx->emtcxofs;
            ctx->emtcxofs = uVar4 + 1;
            ctx->emtcxptr[uVar4] = '\x03';
            emtres(ctx,uVar3);
            memcpy(ctx->emtcxptr + ctx->emtcxofs,base + *(long *)puVar8,(ulong)uVar3);
            ctx->emtcxofs = ctx->emtcxofs + uVar3;
            goto LAB_00120d13;
          }
          if (bVar1 != 0x37) goto switchD_00120b67_caseD_41;
          emtres(ctx,1);
          uVar3 = ctx->emtcxofs;
          ctx->emtcxofs = uVar3 + 1;
          ctx->emtcxptr[uVar3] = '\x01';
          uVar9 = 1;
LAB_00120be0:
          emtres(ctx,4);
          *(uint *)(ctx->emtcxptr + ctx->emtcxofs) = *puVar8;
          ctx->emtcxofs = ctx->emtcxofs + 4;
          goto LAB_00120d13;
        }
        uVar10 = 0xd;
        switch(bVar1) {
        case 0x40:
          break;
        case 0x41:
        case 0x42:
        case 0x43:
        case 0x44:
        case 0x45:
        case 0x47:
        case 0x48:
        case 0x4a:
        case 0x4b:
switchD_00120b67_caseD_41:
          emtres(ctx,1);
          uVar3 = ctx->emtcxofs;
          ctx->emtcxofs = uVar3 + 1;
          ctx->emtcxptr[uVar3] = (uchar)uVar9;
          if (((uchar)uVar9 != '\x05') && (((uint)uVar9 & 0xff) != 8)) goto LAB_00120be0;
          goto LAB_00120d13;
        case 0x46:
          uVar10 = 10;
          break;
        case 0x49:
          uVar10 = 2;
          break;
        case 0x4c:
          emtres(ctx,1);
          uVar3 = ctx->emtcxofs;
          ctx->emtcxofs = uVar3 + 1;
          ctx->emtcxptr[uVar3] = '\a';
          emtlst(ctx,*puVar8,base);
          goto LAB_00120d13;
        case 0x4d:
          uVar9 = 5;
          goto LAB_00120c95;
        case 0x4e:
          uVar9 = 8;
LAB_00120c95:
          emtres(ctx,1);
          uVar3 = ctx->emtcxofs;
          ctx->emtcxofs = uVar3 + 1;
          ctx->emtcxptr[uVar3] = (uchar)uVar9;
          goto LAB_00120d13;
        default:
          if (bVar1 != 0x55) goto switchD_00120b67_caseD_41;
        }
        emtres(ctx,1);
        uVar3 = ctx->emtcxofs;
        ctx->emtcxofs = uVar3 + 1;
        ctx->emtcxptr[uVar3] = (uchar)uVar10;
        emtres(ctx,2);
        *(short *)(ctx->emtcxptr + ctx->emtcxofs) = (short)*puVar8;
        ctx->emtcxofs = ctx->emtcxofs + 2;
        uVar9 = (ulong)uVar10;
LAB_00120d13:
        puVar8 = puVar8 + -4;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
      uVar6 = ctx->emtcxofs;
    }
    *(ushort *)(ctx->emtcxptr + uVar2) = uVar6 - uVar2;
  }
  return;
}

Assistant:

void emtlst(emtcxdef *ctx, uint ofs, uchar *base)
{
    uint      initofs;
    ushort    i;
    emtlidef *lst;
    emtledef *ele;
        
    initofs = ctx->emtcxofs;                        /* save starting offset */
    emtint2(ctx, 2);                             /* emit placeholder length */
    if (ofs == 0) return;              /* nothing more to do for empty list */

    lst = (emtlidef *)(base + ofs);

    for (i = lst->emtlicnt, ele = &lst->emtliele[i-1] ; i ; --ele, --i)
    {
        uchar dat;
        
        switch(ele->emtletyp)
        {
        case TOKTLIST:
            emtbyte(ctx, DAT_LIST);
            emtlst(ctx, (uint)ele->emtleval, base);
            continue;

        case TOKTSSTRING:
        {
            uint oplen = osrp2(base + ele->emtleval);
            
            emtbyte(ctx, DAT_SSTRING);
            emtmem(ctx, base + ele->emtleval, oplen);
            continue;
        }

        case TOKTNUMBER:
            dat = DAT_NUMBER;
            break;
        case TOKTNIL:
            dat = DAT_NIL;
            break;
        case TOKTTRUE:
            dat = DAT_TRUE;
            break;

        case TOKTPOUND:
            dat = DAT_PROPNUM;
            goto symbol;
        case TOKTFUNCTION:
            dat = DAT_FNADDR;
            goto symbol;
        case TOKTOBJECT:
            dat = DAT_OBJECT;
            goto symbol;
        case TOKTDOT:
            dat = DAT_PROPNUM;
            /* FALLTHROUGH */
        symbol:
            emtbyte(ctx, dat);
            emtint2(ctx, (ushort)ele->emtleval);
            continue;

        default:
            assert(FALSE);
            break;
        }
        
        /* if we get here, emit datatype in dat, plus value */
        emtbyte(ctx, dat);
        if (dat != DAT_TRUE && dat != DAT_NIL)
            emtint4(ctx, ele->emtleval);
    }
    oswp2(ctx->emtcxptr + initofs, ctx->emtcxofs - initofs);
}